

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

bool __thiscall
cmComputeTargetDepends::IntraComponent
          (cmComputeTargetDepends *this,vector<int,_std::allocator<int>_> *cmap,int c,int i,
          int *head,set<int,_std::less<int>,_std::allocator<int>_> *emitted,
          set<int,_std::less<int>,_std::allocator<int>_> *visited)

{
  pointer *ppcVar1;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *pvVar2;
  int i_00;
  pointer pcVar3;
  iterator iVar4;
  cmGraphEdge cVar5;
  undefined4 uVar6;
  bool bVar7;
  long lVar8;
  pointer pcVar9;
  pointer pcVar10;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar11;
  int local_4c;
  cmGraphEdge local_48;
  int *local_40;
  pointer local_38;
  
  local_4c = i;
  local_40 = head;
  pVar11 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
           _M_insert_unique<int_const&>
                     ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      visited,&local_4c);
  if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_0045b472:
    bVar7 = false;
  }
  else {
    pVar11 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
             _M_insert_unique<int_const&>
                       ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                        emitted,&local_4c);
    bVar7 = true;
    if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      lVar8 = (long)local_4c;
      pcVar3 = (this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar10 = *(pointer *)
                 &pcVar3[lVar8].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                  super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
      pcVar9 = *(pointer *)
                ((long)&pcVar3[lVar8].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                        super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
      if (pcVar10 != pcVar9) {
        local_38 = pcVar3 + lVar8;
        do {
          i_00 = pcVar10->Dest;
          if (((cmap->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start[i_00] == c) && (pcVar10->Strong == true)) {
            pvVar2 = &(this->FinalGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_start[local_4c].
                      super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
            local_48.Strong = true;
            iVar4._M_current =
                 (pvVar2->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            local_48.Dest = i_00;
            if (iVar4._M_current ==
                (pvVar2->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::_M_realloc_insert<cmGraphEdge>
                        (pvVar2,iVar4,&local_48);
            }
            else {
              cVar5.Strong = true;
              cVar5._5_3_ = local_48._5_3_;
              cVar5.Dest = i_00;
              *iVar4._M_current = cVar5;
              ppcVar1 = &(pvVar2->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppcVar1 = *ppcVar1 + 1;
            }
            bVar7 = IntraComponent(this,cmap,c,i_00,local_40,emitted,visited);
            if (!bVar7) goto LAB_0045b472;
            pcVar9 = *(pointer *)
                      ((long)&(local_38->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                              super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
          }
          pcVar10 = pcVar10 + 1;
        } while (pcVar10 != pcVar9);
      }
      uVar6 = local_48._4_4_;
      local_48.Dest = *local_40;
      if (local_48.Dest < 0) {
        (this->ComponentTail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[c] = local_4c;
      }
      else {
        pvVar2 = &(this->FinalGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>
                  .super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                  super__Vector_impl_data._M_start[local_4c].
                  super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
        local_48._4_4_ = local_48._4_4_ & 0xffffff00;
        iVar4._M_current =
             (pvVar2->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (pvVar2->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::_M_realloc_insert<cmGraphEdge>
                    (pvVar2,iVar4,&local_48);
        }
        else {
          *iVar4._M_current = (cmGraphEdge)(CONCAT44(uVar6,local_48.Dest) & 0xffffff00ffffffff);
          ppcVar1 = &(pvVar2->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>)._M_impl
                     .super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
      }
      *local_40 = local_4c;
      bVar7 = true;
    }
  }
  return bVar7;
}

Assistant:

bool cmComputeTargetDepends::IntraComponent(std::vector<int> const& cmap,
                                            int c, int i, int* head,
                                            std::set<int>& emitted,
                                            std::set<int>& visited)
{
  if (!visited.insert(i).second) {
    // Cycle in utility depends!
    return false;
  }
  if (emitted.insert(i).second) {
    // Honor strong intra-component edges in the final order.
    EdgeList const& el = this->InitialGraph[i];
    for (EdgeList::const_iterator ei = el.begin(); ei != el.end(); ++ei) {
      int j = *ei;
      if (cmap[j] == c && ei->IsStrong()) {
        this->FinalGraph[i].push_back(cmGraphEdge(j, true));
        if (!this->IntraComponent(cmap, c, j, head, emitted, visited)) {
          return false;
        }
      }
    }

    // Prepend to a linear linked-list of intra-component edges.
    if (*head >= 0) {
      this->FinalGraph[i].push_back(cmGraphEdge(*head, false));
    } else {
      this->ComponentTail[c] = i;
    }
    *head = i;
  }
  return true;
}